

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappingExample.cpp
# Opt level: O2

double GetMapping<double>(double mapMe,vector<double,_std::allocator<double>_> *mappings)

{
  reference pvVar1;
  ostream *poVar2;
  bool bVar3;
  ulong uVar4;
  value_type vVar5;
  
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Mapping range: ");
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(mappings,uVar4);
    poVar2 = std::ostream::_M_insert<double>(*pvVar1);
    std::operator<<(poVar2," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  bVar3 = true;
  uVar4 = 0;
  vVar5 = mapMe;
  do {
    uVar4 = (ulong)(int)uVar4;
    while( true ) {
      if (((ulong)((long)(mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3) <= uVar4) || (!bVar3)) {
        poVar2 = std::ostream::_M_insert<double>(mapMe);
        std::operator<<(poVar2," is mapped to ");
        poVar2 = std::ostream::_M_insert<double>(vVar5);
        std::endl<char,std::char_traits<char>>(poVar2);
        return vVar5;
      }
      pvVar1 = std::vector<double,_std::allocator<double>_>::at(mappings,uVar4);
      bVar3 = *pvVar1 < mapMe;
      if (!bVar3) break;
      uVar4 = uVar4 + 1;
    }
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(mappings,uVar4);
    vVar5 = *pvVar1;
  } while( true );
}

Assistant:

MapType GetMapping(MapType mapMe, vector<MapType> mappings){
   MapType result = mapMe;
   int i;
   bool keepLooking;

   keepLooking = true;

   cout << endl;
   cout << "Mapping range: ";
   for (i = 0; i < mappings.size(); ++i) {
      cout << mappings.at(i) << " ";
   }
   cout << endl;

   i = 0;       // Restart counting
   while ((i < mappings.size()) && keepLooking) {
      if(mapMe <= mappings.at(i)) {
         result = mappings.at(i);
         keepLooking = false;
      }
      else {
         ++i;
      }
   }

   cout << mapMe << " is mapped to " << result << endl;

   return result;
}